

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O1

bool __thiscall QMakeSourceFileInfo::isSystemInclude(QMakeSourceFileInfo *this,QString *name)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  undefined8 *puVar4;
  ulong uVar5;
  undefined8 *puVar6;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QByteArrayView QVar9;
  QDir systemDir;
  QArrayData *local_b0;
  undefined8 *local_a8;
  QArrayData *local_98;
  undefined8 *puStack_90;
  undefined8 local_88;
  QArrayData *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *local_60;
  QArrayData *local_58;
  undefined8 *puStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = QDir::isRelativePath((QString *)name);
  if (cVar2 == '\0') {
    bVar8 = (this->systemIncludes).d.size != 0;
    if (bVar8) {
      lVar7 = 0;
      uVar5 = 0;
      do {
        local_60 = &DAT_aaaaaaaaaaaaaaaa;
        QDir::QDir((QDir *)&local_60,
                   (QString *)((long)&(((this->systemIncludes).d.ptr)->d).d + lVar7));
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        QDir::relativeFilePath((QString *)&local_78);
        cVar3 = QDir::isRelativePath((QString *)&local_78);
        cVar2 = '\x01';
        if (cVar3 != '\0') {
          QVar9.m_data = (storage_type *)0x3;
          QVar9.m_size = (qsizetype)&local_58;
          QString::fromUtf8(QVar9);
          local_98 = local_58;
          puStack_90 = puStack_50;
          local_88 = local_48;
          cVar2 = QString::startsWith((QString *)&local_78,(CaseSensitivity)&local_98);
          if (local_98 != (QArrayData *)0x0) {
            LOCK();
            (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_98,2,0x10);
            }
          }
        }
        if (Option::debug_level != 0 && cVar2 == '\0') {
          QString::toLocal8Bit_helper((QChar *)&local_58,(longlong)(name->d).ptr);
          puVar6 = puStack_50;
          if (puStack_50 == (undefined8 *)0x0) {
            puVar6 = &QByteArray::_empty;
          }
          QString::toLocal8Bit_helper
                    ((QChar *)&local_b0,
                     *(longlong *)((long)&(((this->systemIncludes).d.ptr)->d).ptr + lVar7));
          puVar4 = local_a8;
          if (local_a8 == (undefined8 *)0x0) {
            puVar4 = &QByteArray::_empty;
          }
          debug_msg_internal(5,"File/dir %s is in system dir %s, skipping",puVar6,puVar4);
          if (local_b0 != (QArrayData *)0x0) {
            LOCK();
            (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_b0,1,0x10);
            }
          }
          if (local_58 != (QArrayData *)0x0) {
            LOCK();
            (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_58,1,0x10);
            }
          }
        }
        if (local_78 != (QArrayData *)0x0) {
          LOCK();
          (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_78,2,0x10);
          }
        }
        QDir::~QDir((QDir *)&local_60);
        if (cVar2 == '\0') break;
        uVar5 = uVar5 + 1;
        lVar7 = lVar7 + 0x18;
        uVar1 = (this->systemIncludes).d.size;
        bVar8 = uVar5 < uVar1;
      } while (uVar5 < uVar1);
    }
  }
  else {
    bVar8 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeSourceFileInfo::isSystemInclude(const QString &name)
{
    if (QDir::isRelativePath(name)) {
        // if we got a relative path here, it's either an -I flag with a relative path
        // or an include file we couldn't locate. Either way, conclude it's not
        // a system include.
        return false;
    }

    for (int i = 0; i < systemIncludes.size(); ++i) {
        // check if name is located inside the system include dir:
        QDir systemDir(systemIncludes.at(i));
        QString relativePath = systemDir.relativeFilePath(name);

        // the relative path might be absolute if we're crossing drives on Windows
        if (QDir::isAbsolutePath(relativePath) || relativePath.startsWith("../"))
            continue;
        debug_msg(5, "File/dir %s is in system dir %s, skipping",
                  qPrintable(name), qPrintable(systemIncludes.at(i)));
        return true;
    }
    return false;
}